

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dstu.c
# Opt level: O1

err_t dstuParamsStd(dstu_params *params,char *name)

{
  bool_t bVar1;
  int iVar2;
  size_t sVar3;
  octet *poVar4;
  
  bVar1 = memIsValid(params,0x110);
  if (bVar1 == 0) {
    return 0x6d;
  }
  memSet(params,'\0',0x110);
  iVar2 = strCmp(name,"1.2.804.2.1.1.1.1.3.1.1.1.2.0");
  if (iVar2 == 0) {
    memCopy(params,_curve163pb_p,8);
    params->A = '\x01';
    memCopy(params->B,_curve163pb_B,0x15);
    memCopy(params->n,_curve163pb_n,0x15);
    params->c = 2;
    memCopy(params->P,_curve163pb_P,0x2a);
    return 0;
  }
  iVar2 = strCmp(name,"1.2.804.2.1.1.1.1.3.1.1.1.2.1");
  if (iVar2 == 0) {
    memCopy(params,_curve167pb_p,8);
    params->A = '\x01';
    memCopy(params->B,_curve167pb_B,0x15);
    poVar4 = _curve167pb_n;
    sVar3 = 0x15;
  }
  else {
    iVar2 = strCmp(name,"1.2.804.2.1.1.1.1.3.1.1.1.2.2");
    if (iVar2 == 0) {
      memCopy(params,_curve173pb_p,8);
      params->A = '\0';
      memCopy(params->B,_curve173pb_B,0x16);
      poVar4 = _curve173pb_n;
      sVar3 = 0x16;
LAB_0014060b:
      memCopy(params->n,poVar4,sVar3);
      params->c = 4;
      return 0;
    }
    iVar2 = strCmp(name,"1.2.804.2.1.1.1.1.3.1.1.1.2.3");
    if (iVar2 == 0) {
      memCopy(params,_curve179pb_p,8);
      params->A = '\x01';
      memCopy(params->B,_curve179pb_B,0x17);
      poVar4 = _curve179pb_n;
      sVar3 = 0x17;
    }
    else {
      iVar2 = strCmp(name,"1.2.804.2.1.1.1.1.3.1.1.1.2.4");
      if (iVar2 == 0) {
        memCopy(params,_curve191pb_p,8);
        params->A = '\x01';
        memCopy(params->B,_curve191pb_B,0x18);
        poVar4 = _curve191pb_n;
        sVar3 = 0x18;
      }
      else {
        iVar2 = strCmp(name,"1.2.804.2.1.1.1.1.3.1.1.1.2.5");
        if (iVar2 == 0) {
          memCopy(params,_curve233pb_p,8);
          params->A = '\x01';
          memCopy(params->B,_curve233pb_B,0x1e);
          poVar4 = _curve233pb_n;
          sVar3 = 0x1e;
        }
        else {
          iVar2 = strCmp(name,"1.2.804.2.1.1.1.1.3.1.1.1.2.6");
          if (iVar2 == 0) {
            memCopy(params,_curve257pb_p,8);
            params->A = '\0';
            memCopy(params->B,_curve257pb_B,0x21);
            poVar4 = _curve257pb_n;
            sVar3 = 0x20;
            goto LAB_0014060b;
          }
          iVar2 = strCmp(name,"1.2.804.2.1.1.1.1.3.1.1.1.2.7");
          if (iVar2 == 0) {
            memCopy(params,_curve307pb_p,8);
            params->A = '\x01';
            memCopy(params->B,_curve307pb_B,0x27);
            poVar4 = _curve307pb_n;
            sVar3 = 0x27;
          }
          else {
            iVar2 = strCmp(name,"1.2.804.2.1.1.1.1.3.1.1.1.2.8");
            if (iVar2 == 0) {
              memCopy(params,_curve367pb_p,8);
              params->A = '\x01';
              memCopy(params->B,_curve367pb_B,0x2e);
              poVar4 = _curve367pb_n;
              sVar3 = 0x2e;
            }
            else {
              iVar2 = strCmp(name,"1.2.804.2.1.1.1.1.3.1.1.1.2.9");
              if (iVar2 != 0) {
                return 0xca;
              }
              memCopy(params,_curve431pb_p,8);
              params->A = '\x01';
              memCopy(params->B,_curve431pb_B,0x36);
              poVar4 = _curve431pb_n;
              sVar3 = 0x36;
            }
          }
        }
      }
    }
  }
  memCopy(params->n,poVar4,sVar3);
  params->c = 2;
  return 0;
}

Assistant:

err_t dstuParamsStd(dstu_params* params, const char* name)
{
	if (!memIsValid(params, sizeof(dstu_params)))
		return ERR_BAD_INPUT;
	memSetZero(params, sizeof(dstu_params));
	if (strEq(name, _curve163pb_name))
	{
		_LOAD_NAMED_PARAMS(params, curve163pb);
		memCopy(params->P, _curve163pb_P, sizeof(_curve163pb_P));
		return ERR_OK;
	}
	if (strEq(name, _curve167pb_name))
	{
		_LOAD_NAMED_PARAMS(params, curve167pb);
		return ERR_OK;
	}
	if (strEq(name, _curve173pb_name))
	{
		_LOAD_NAMED_PARAMS(params, curve173pb);
		return ERR_OK;
	}
	if (strEq(name, _curve179pb_name))
	{
		_LOAD_NAMED_PARAMS(params, curve179pb);
		return ERR_OK;
	}
	if (strEq(name, _curve191pb_name))
	{
		_LOAD_NAMED_PARAMS(params, curve191pb);
		return ERR_OK;
	}
	if (strEq(name, _curve233pb_name))
	{
		_LOAD_NAMED_PARAMS(params, curve233pb);
		return ERR_OK;
	}
	if (strEq(name, _curve257pb_name))
	{
		_LOAD_NAMED_PARAMS(params, curve257pb);
		return ERR_OK;
	}
	if (strEq(name, _curve307pb_name))
	{
		_LOAD_NAMED_PARAMS(params, curve307pb);
		return ERR_OK;
	}
	if (strEq(name, _curve367pb_name))
	{
		_LOAD_NAMED_PARAMS(params, curve367pb);
		return ERR_OK;
	}
	if (strEq(name, _curve431pb_name))
	{
		_LOAD_NAMED_PARAMS(params, curve431pb);
		return ERR_OK;
	}
	return ERR_FILE_NOT_FOUND;
}